

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::TaskSet::Task::~Task(Task *this)

{
  Own<kj::_::PromiseNode>::dispose(&this->node);
  Own<kj::TaskSet::Task>::dispose(&(this->next).ptr);
  _::Event::~Event(&this->super_Event);
  return;
}

Assistant:

Task(TaskSet& taskSet, Own<_::PromiseNode>&& nodeParam)
      : taskSet(taskSet), node(kj::mv(nodeParam)) {
    node->setSelfPointer(&node);
    node->onReady(this);
  }